

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsBrokerSendOrderedCommand(HelicsBroker broker,char *target,char *command,HelicsError *err)

{
  element_type *peVar1;
  BrokerObject *pBVar2;
  size_t sVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  
  pBVar2 = helics::getBrokerObject(broker,err);
  if ((pBVar2 != (BrokerObject *)0x0) &&
     (peVar1 = (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var6 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (target != (char *)0x0) {
      sVar3 = strlen(target);
      _Var6._M_p = target;
    }
    sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (command != (char *)0x0) {
      sVar4 = strlen(command);
      _Var5._M_p = command;
    }
    (*peVar1->_vptr_Broker[0x13])(peVar1,sVar3,_Var6._M_p,sVar4,_Var5._M_p,1);
    return;
  }
  return;
}

Assistant:

void helicsBrokerSendOrderedCommand(HelicsBroker broker, const char* target, const char* command, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    brk->sendCommand(AS_STRING_VIEW(target), AS_STRING_VIEW(command), HELICS_SEQUENCING_MODE_ORDERED);
}